

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O3

void __thiscall sf::Shape::updateOutline(Shape *this)

{
  size_t index;
  VertexArray *this_00;
  VertexArray *this_01;
  Vector2f VVar1;
  undefined8 uVar2;
  size_t sVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  size_t sVar6;
  size_t index_00;
  size_t index_01;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar25;
  uint uVar26;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar27;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar31 [16];
  FloatRect FVar35;
  float local_c8;
  float fStack_c4;
  Vector2f local_b8;
  float local_98;
  float fStack_94;
  undefined1 auVar24 [16];
  
  if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
    this_00 = &this->m_vertices;
    sVar3 = VertexArray::getVertexCount(this_00);
    this_01 = &this->m_outlineVertices;
    VertexArray::resize(this_01,sVar3 * 2 - 2);
    sVar3 = sVar3 - 2;
    if (sVar3 != 0) {
      index_01 = 1;
      lVar7 = 0;
      sVar6 = 0;
      do {
        index = sVar6 + 1;
        bVar8 = lVar7 == 0;
        lVar7 = lVar7 + -1;
        index_00 = sVar6;
        if (bVar8) {
          index_00 = sVar3;
        }
        pVVar4 = VertexArray::operator[](this_00,index_00);
        uVar2 = *(undefined8 *)&(pVVar4->position).y;
        fVar32 = (pVVar4->position).x;
        pVVar4 = VertexArray::operator[](this_00,index);
        VVar1 = pVVar4->position;
        pVVar4 = VertexArray::operator[](this_00,sVar6 + 2);
        local_b8.x = VVar1.x;
        local_b8.y = VVar1.y;
        local_98 = (float)uVar2;
        fStack_94 = (float)((ulong)uVar2 >> 0x20);
        local_98 = local_98 - local_b8.y;
        fVar32 = local_b8.x - fVar32;
        auVar28._4_4_ = fVar32;
        auVar28._0_4_ = local_98;
        fVar11 = local_b8.y - (pVVar4->position).y;
        fVar12 = (pVVar4->position).x - local_b8.x;
        auVar21._4_4_ = fVar12;
        auVar21._0_4_ = fVar11;
        fVar13 = local_b8.y - (float)pVVar4->color;
        fVar14 = local_b8.y - local_b8.y;
        auVar15._0_4_ = fVar12 * fVar12;
        auVar15._4_4_ = fVar32 * fVar32;
        auVar15._8_4_ = fVar13 * fVar13;
        auVar15._12_4_ = fVar14 * fVar14;
        auVar19._0_4_ = fVar11 * fVar11 + auVar15._0_4_;
        auVar19._4_4_ = local_98 * local_98 + auVar15._4_4_;
        auVar19._8_4_ = fVar12 * fVar12 + auVar15._8_4_;
        auVar19._12_4_ = fVar32 * fVar32 + auVar15._12_4_;
        auVar15 = sqrtps(auVar15,auVar19);
        auVar16._0_4_ = auVar15._0_4_;
        fVar18 = auVar15._4_4_;
        auVar20._4_4_ = fVar18;
        auVar20._0_4_ = fVar18;
        auVar20._8_4_ = fVar18;
        auVar20._12_4_ = fVar18;
        auVar28._8_4_ = fStack_94 - local_b8.y;
        auVar28._12_4_ = local_b8.y - local_b8.y;
        auVar15 = divps(auVar28,auVar20);
        uVar9 = -(uint)(auVar16._0_4_ != 0.0);
        uVar10 = -(uint)(fVar18 != 0.0);
        fVar18 = (float)(~uVar10 & (uint)local_98 | auVar15._0_4_ & uVar10);
        fVar25 = (float)(~uVar10 & (uint)fVar32 | auVar15._4_4_ & uVar10);
        uVar26 = ~uVar10 & (uint)(fStack_94 - local_b8.y) | auVar15._8_4_ & uVar10;
        uVar27 = ~uVar10 & (uint)(local_b8.y - local_b8.y) | auVar15._12_4_ & uVar10;
        auVar16._4_4_ = auVar16._0_4_;
        auVar16._8_4_ = auVar16._0_4_;
        auVar16._12_4_ = auVar16._0_4_;
        auVar21._8_4_ = fVar13;
        auVar21._12_4_ = fVar14;
        auVar15 = divps(auVar21,auVar16);
        fVar30 = (float)(~uVar9 & (uint)fVar11 | auVar15._0_4_ & uVar9);
        fVar12 = (float)(~uVar9 & (uint)fVar12 | auVar15._4_4_ & uVar9);
        uVar33 = ~uVar10 & (uint)fVar13 | auVar15._8_4_ & uVar10;
        uVar34 = ~uVar10 & (uint)fVar14 | auVar15._12_4_ & uVar10;
        pVVar4 = VertexArray::operator[](this_00,0);
        fVar32 = (pVVar4->position).x;
        fVar11 = (pVVar4->position).y;
        pVVar4 = VertexArray::operator[](this_00,0);
        uVar9 = -(uint)(0.0 < fVar30 * ((pVVar4->position).x - local_b8.x) +
                              fVar12 * ((pVVar4->position).y - local_b8.y));
        uVar10 = -(uint)(0.0 < fVar18 * (fVar32 - local_b8.x) + fVar25 * (fVar11 - local_b8.y));
        auVar31._0_4_ = (uint)-fVar18 & uVar10;
        auVar31._4_4_ = (uint)-fVar25 & uVar10;
        auVar31._8_4_ = (uVar26 ^ 0x80000000) & uVar10;
        auVar31._12_4_ = (uVar27 ^ 0x80000000) & uVar10;
        auVar17._0_4_ = ~uVar10 & (uint)fVar18;
        auVar17._4_4_ = ~uVar10 & (uint)fVar25;
        auVar17._8_4_ = ~uVar10 & uVar26;
        auVar17._12_4_ = ~uVar10 & uVar27;
        auVar17 = auVar17 | auVar31;
        fVar11 = (float)((uint)-fVar30 & uVar9 | ~uVar9 & (uint)fVar30);
        fVar12 = (float)((uint)-fVar12 & uVar9 | ~uVar9 & (uint)fVar12);
        fVar32 = auVar17._4_4_;
        auVar22._0_4_ = auVar17._0_4_ * fVar11 + fVar32 * fVar12 + 1.0;
        auVar22._4_12_ = auVar17._4_12_;
        auVar29._0_4_ = fVar11 + auVar17._0_4_;
        auVar29._4_4_ = fVar12 + fVar32;
        auVar29._8_4_ = (float)((uVar33 ^ 0x80000000) & uVar10 | ~uVar10 & uVar33) + auVar17._8_4_;
        auVar29._12_4_ = (float)((uVar34 ^ 0x80000000) & uVar10 | ~uVar10 & uVar34) + auVar17._12_4_
        ;
        auVar24._0_8_ = auVar22._0_8_;
        auVar24._8_4_ = fVar32;
        auVar24._12_4_ = fVar32;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23._4_4_ = auVar22._0_4_;
        auVar23._0_4_ = auVar22._0_4_;
        auVar15 = divps(auVar29,auVar23);
        pVVar4 = VertexArray::operator[](this_01,index_01 - 1);
        (pVVar4->position).x = local_b8.x;
        (pVVar4->position).y = local_b8.y;
        local_c8 = auVar15._0_4_;
        fStack_c4 = auVar15._4_4_;
        local_b8.y = this->m_outlineThickness * fStack_c4 + local_b8.y;
        local_b8.x = this->m_outlineThickness * local_c8 + local_b8.x;
        pVVar4 = VertexArray::operator[](this_01,index_01);
        pVVar4->position = local_b8;
        index_01 = index_01 + 2;
        sVar6 = index;
      } while (index != sVar3);
    }
    pVVar4 = VertexArray::operator[](this_01,0);
    pVVar5 = VertexArray::operator[](this_01,sVar3 * 2);
    pVVar5->position = pVVar4->position;
    pVVar4 = VertexArray::operator[](this_01,1);
    pVVar5 = VertexArray::operator[](this_01,sVar3 * 2 + 1);
    pVVar5->position = pVVar4->position;
    updateOutlineColors(this);
    FVar35 = VertexArray::getBounds(this_01);
    this->m_bounds = FVar35;
  }
  else {
    VertexArray::clear(&this->m_outlineVertices);
    fVar32 = (this->m_insideBounds).top;
    fVar11 = (this->m_insideBounds).width;
    fVar12 = (this->m_insideBounds).height;
    (this->m_bounds).left = (this->m_insideBounds).left;
    (this->m_bounds).top = fVar32;
    (this->m_bounds).width = fVar11;
    (this->m_bounds).height = fVar12;
  }
  return;
}

Assistant:

void Shape::updateOutline()
{
    // Return if there is no outline
    if (m_outlineThickness == 0.f)
    {
        m_outlineVertices.clear();
        m_bounds = m_insideBounds;
        return;
    }

    std::size_t count = m_vertices.getVertexCount() - 2;
    m_outlineVertices.resize((count + 1) * 2);

    for (std::size_t i = 0; i < count; ++i)
    {
        std::size_t index = i + 1;

        // Get the two segments shared by the current point
        Vector2f p0 = (i == 0) ? m_vertices[count].position : m_vertices[index - 1].position;
        Vector2f p1 = m_vertices[index].position;
        Vector2f p2 = m_vertices[index + 1].position;

        // Compute their normal
        Vector2f n1 = computeNormal(p0, p1);
        Vector2f n2 = computeNormal(p1, p2);

        // Make sure that the normals point towards the outside of the shape
        // (this depends on the order in which the points were defined)
        if (dotProduct(n1, m_vertices[0].position - p1) > 0)
            n1 = -n1;
        if (dotProduct(n2, m_vertices[0].position - p1) > 0)
            n2 = -n2;

        // Combine them to get the extrusion direction
        float factor = 1.f + (n1.x * n2.x + n1.y * n2.y);
        Vector2f normal = (n1 + n2) / factor;

        // Update the outline points
        m_outlineVertices[i * 2 + 0].position = p1;
        m_outlineVertices[i * 2 + 1].position = p1 + normal * m_outlineThickness;
    }

    // Duplicate the first point at the end, to close the outline
    m_outlineVertices[count * 2 + 0].position = m_outlineVertices[0].position;
    m_outlineVertices[count * 2 + 1].position = m_outlineVertices[1].position;

    // Update outline colors
    updateOutlineColors();

    // Update the shape's bounds
    m_bounds = m_outlineVertices.getBounds();
}